

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fileHasMoved(unixFile *pFile)

{
  int iVar1;
  long in_RDI;
  long in_FS_OFFSET;
  stat buf;
  bool local_a2;
  bool local_a1;
  undefined1 local_98 [8];
  long local_90;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_98,0xaa,0x90);
  local_a1 = false;
  if (*(long *)(in_RDI + 0x10) != 0) {
    iVar1 = (*aSyscall[4].pCurrent)(*(undefined8 *)(in_RDI + 0x38),local_98);
    local_a2 = true;
    if (iVar1 == 0) {
      local_a2 = local_90 != *(long *)(*(long *)(in_RDI + 0x10) + 8);
    }
    local_a1 = local_a2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (uint)local_a1;
  }
  __stack_chk_fail();
}

Assistant:

static int fileHasMoved(unixFile *pFile){
#if OS_VXWORKS
  return pFile->pInode!=0 && pFile->pId!=pFile->pInode->fileId.pId;
#else
  struct stat buf;
  return pFile->pInode!=0 &&
      (osStat(pFile->zPath, &buf)!=0
         || (u64)buf.st_ino!=pFile->pInode->fileId.ino);
#endif
}